

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power)

{
  ImGuiContext *pIVar1;
  double local_148;
  double local_138;
  float local_118;
  float local_110;
  unsigned_long_long local_f8;
  unsigned_long_long local_e8;
  longlong local_c8;
  longlong local_b8;
  uint local_98;
  uint local_90;
  int local_78;
  int local_70;
  ImGuiContext *g;
  float power_local;
  char *format_local;
  void *v_max_local;
  void *v_min_local;
  float v_speed_local;
  void *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  if (GImGui->ActiveId == id) {
    if ((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
       (((GImGui->IO).MouseDown[0] & 1U) == 0)) {
      ClearActiveID();
    }
    else if ((GImGui->ActiveIdSource == ImGuiInputSource_Nav) &&
            ((GImGui->NavActivatePressedId == id && ((GImGui->ActiveIdIsJustActivated & 1U) == 0))))
    {
      ClearActiveID();
    }
  }
  if (pIVar1->ActiveId == id) {
    switch(data_type) {
    case 0:
      if (v_min == (void *)0x0) {
        local_70 = -0x80000000;
      }
      else {
        local_70 = *v_min;
      }
      if (v_max == (void *)0x0) {
        local_78 = 0x7fffffff;
      }
      else {
        local_78 = *v_max;
      }
      data_type_local._3_1_ =
           DragBehaviorT<int,int,float>(data_type,(int *)v,v_speed,local_70,local_78,format,power);
      break;
    case 1:
      if (v_min == (void *)0x0) {
        local_90 = 0;
      }
      else {
        local_90 = *v_min;
      }
      if (v_max == (void *)0x0) {
        local_98 = 0xffffffff;
      }
      else {
        local_98 = *v_max;
      }
      data_type_local._3_1_ =
           DragBehaviorT<unsigned_int,int,float>
                     (data_type,(uint *)v,v_speed,local_90,local_98,format,power);
      break;
    case 2:
      if (v_min == (void *)0x0) {
        local_b8 = -0x8000000000000000;
      }
      else {
        local_b8 = *v_min;
      }
      if (v_max == (void *)0x0) {
        local_c8 = 0x7fffffffffffffff;
      }
      else {
        local_c8 = *v_max;
      }
      data_type_local._3_1_ =
           DragBehaviorT<long_long,long_long,double>
                     (data_type,(longlong *)v,v_speed,local_b8,local_c8,format,power);
      break;
    case 3:
      if (v_min == (void *)0x0) {
        local_e8 = 0;
      }
      else {
        local_e8 = *v_min;
      }
      if (v_max == (void *)0x0) {
        local_f8 = 0xffffffffffffffff;
      }
      else {
        local_f8 = *v_max;
      }
      data_type_local._3_1_ =
           DragBehaviorT<unsigned_long_long,long_long,double>
                     (data_type,(unsigned_long_long *)v,v_speed,local_e8,local_f8,format,power);
      break;
    case 4:
      if (v_min == (void *)0x0) {
        local_110 = -3.4028235e+38;
      }
      else {
        local_110 = *v_min;
      }
      if (v_max == (void *)0x0) {
        local_118 = 3.4028235e+38;
      }
      else {
        local_118 = *v_max;
      }
      data_type_local._3_1_ =
           DragBehaviorT<float,float,float>
                     (data_type,(float *)v,v_speed,local_110,local_118,format,power);
      break;
    case 5:
      if (v_min == (void *)0x0) {
        local_138 = -1.79769313486232e+308;
      }
      else {
        local_138 = *v_min;
      }
      if (v_max == (void *)0x0) {
        local_148 = 1.79769313486232e+308;
      }
      else {
        local_148 = *v_max;
      }
      data_type_local._3_1_ =
           DragBehaviorT<double,double,double>
                     (data_type,(double *)v,v_speed,local_138,local_148,format,power);
      break;
    case 6:
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x24c0,
                    "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
  }
  else {
    data_type_local._3_1_ = false;
  }
  return data_type_local._3_1_;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}